

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_equal(lua_State *L,int index1,int index2)

{
  int iVar1;
  TValue *t1;
  TValue *t2;
  bool local_31;
  uint local_30;
  int i;
  StkId o2;
  StkId o1;
  int index2_local;
  int index1_local;
  lua_State *L_local;
  
  t1 = index2adr(L,index1);
  t2 = index2adr(L,index2);
  if ((t1 == &luaO_nilobject_) || (t2 == &luaO_nilobject_)) {
    local_30 = 0;
  }
  else {
    local_31 = false;
    if (t1->tt == t2->tt) {
      iVar1 = luaV_equalval(L,t1,t2);
      local_31 = iVar1 != 0;
    }
    local_30 = (uint)local_31;
  }
  return local_30;
}

Assistant:

LUA_API int lua_equal (lua_State *L, int index1, int index2) {
  StkId o1, o2;
  int i;
  lua_lock(L);  /* may call tag method */
  o1 = index2adr(L, index1);
  o2 = index2adr(L, index2);
  i = (o1 == luaO_nilobject || o2 == luaO_nilobject) ? 0 : equalobj(L, o1, o2);
  lua_unlock(L);
  return i;
}